

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O1

Pass * wasm::createStringLiftingPass(void)

{
  Pass *__s;
  
  __s = (Pass *)operator_new(0x120);
  memset(__s,0,0x120);
  __s->runner = (PassRunner *)0x0;
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name)._M_string_length = 0;
  (__s->name).field_2._M_local_buf[0] = '\0';
  (__s->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  __s->_vptr_Pass = (_func_int **)&PTR__StringLifting_01094c88;
  __s[1]._vptr_Pass = (_func_int **)&__s[1].passArg;
  __s[1].runner = (PassRunner *)0x1;
  __s[1].name._M_dataplus._M_p = (pointer)0x0;
  __s[1].name._M_string_length = 0;
  *(undefined4 *)&__s[1].name.field_2 = 0x3f800000;
  memset((void *)((long)&__s[1].name.field_2 + 8),0,0xa0);
  return __s;
}

Assistant:

Pass* createStringLiftingPass() { return new StringLifting(); }